

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_EvilParseFallthrough_Test::TestBody(TApp_EvilParseFallthrough_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  App *pAVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  iterator local_130;
  size_type local_128;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  App *local_80;
  App *sub;
  string local_70;
  allocator local_39;
  string local_38;
  int local_18 [2];
  int val2;
  int val1;
  TApp_EvilParseFallthrough_Test *this_local;
  
  pAVar2 = &(this->super_TApp).app;
  _val2 = this;
  CLI::App::fallthrough(pAVar2,true);
  local_18[1] = 0;
  local_18[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--val1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&sub + 7));
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar2,&local_38,local_18 + 1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"sub",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"val2",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"",&local_119);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar2,&local_f0,local_18,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  gtest_ar.message_.ptr_._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b0,"sub",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"--val1",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"1",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"2",(allocator *)((long)&gtest_ar.message_.ptr_ + 4));
  gtest_ar.message_.ptr_._3_1_ = 0;
  local_130 = &local_1b0;
  local_128 = 4;
  __l._M_len = 4;
  __l._M_array = local_130;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
  do {
    local_2b0 = local_2b0 + -1;
    std::__cxx11::string::~string((string *)local_2b0);
  } while (local_2b0 != &local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_1d4 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1d0,"1","val1",&local_1d4,local_18 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x12e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_1fc = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1f8,"2","val2",&local_1fc,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x12f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  return;
}

Assistant:

TEST_F(TApp, EvilParseFallthrough) {
    app.fallthrough();
    int val1 = 0, val2 = 0;
    app.add_option("--val1", val1);

    auto sub = app.add_subcommand("sub");
    sub->add_option("val2", val2);

    args = {"sub", "--val1", "1", "2"};
    // Should not throw
    run();

    EXPECT_EQ(1, val1);
    EXPECT_EQ(2, val2);
}